

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch2sin.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  double *sawtooth;
  PeriodicWaveformGeneration *this;
  ifstream *input_stream;
  double *sin;
  double *cos;
  int interpolation_period;
  int frame_period;
  allocator local_4d5;
  int local_4d4;
  undefined8 local_4d0;
  double signal;
  double unvoiced_value;
  undefined1 local_4b8 [32];
  PeriodicWaveformGeneration waveform_generation;
  ostringstream error_message_7;
  InputSourceInterpolationWithMagicNumber input_source_interpolation_with_magic_number;
  ifstream ifs;
  byte abStack_238 [488];
  InputSourceFromStream input_source_from_stream;
  
  frame_period = 100;
  interpolation_period = 1;
  unvoiced_value = 0.0;
  local_4d0 = 0;
  local_4d4 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"p:i:o:u:sh",(option *)0x0,(int *)0x0);
    if (0xd < iVar4 - 0x68U) {
      if (iVar4 != -1) {
switchD_0010366a_caseD_6a:
        anon_unknown.dwarf_1e42::PrintUsage((ostream *)&std::cerr);
        return 1;
      }
      if (frame_period / 2 < interpolation_period) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar5 = std::operator<<((ostream *)&ifs,
                                 "Interpolation period must be equal to or less than half ");
        std::operator<<(poVar5,"frame period");
        std::__cxx11::string::string
                  ((string *)&error_message_7,"pitch2sin",
                   (allocator *)&input_source_interpolation_with_magic_number);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_00103954;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string
                  ((string *)&error_message_7,"pitch2sin",
                   (allocator *)&input_source_interpolation_with_magic_number);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_00103954;
      }
      if (argc == ya_optind) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Cannot set translation mode");
        std::__cxx11::string::string
                  ((string *)&error_message_7,"pitch2sin",
                   (allocator *)&input_source_interpolation_with_magic_number);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_00103954;
      }
      input_stream = &ifs;
      std::ifstream::ifstream(input_stream);
      if ((pcVar6 != (char *)0x0) &&
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar6),
         (abStack_238[*(long *)(_ifs + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
        poVar5 = std::operator<<((ostream *)&error_message_7,"Cannot open file ");
        std::operator<<(poVar5,pcVar6);
        std::__cxx11::string::string
                  ((string *)&input_source_interpolation_with_magic_number,"pitch2sin",
                   (allocator *)&waveform_generation);
        sptk::PrintErrorMessage
                  ((string *)&input_source_interpolation_with_magic_number,&error_message_7);
        std::__cxx11::string::~string((string *)&input_source_interpolation_with_magic_number);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
        iVar4 = 1;
        goto LAB_00103dc3;
      }
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        input_stream = (ifstream *)&std::cin;
      }
      iVar4 = 1;
      sptk::InputSourceFromStream::InputSourceFromStream
                (&input_source_from_stream,false,1,(istream *)input_stream);
      sptk::InputSourceInterpolationWithMagicNumber::InputSourceInterpolationWithMagicNumber
                (&input_source_interpolation_with_magic_number,frame_period,interpolation_period,
                 false,0.0,&input_source_from_stream.super_InputSourceInterface);
      if (input_source_interpolation_with_magic_number.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
        std::operator<<((ostream *)&error_message_7,"Failed to initialize InputSourceFromStream");
        std::__cxx11::string::string
                  ((string *)&waveform_generation,"pitch2sin",(allocator *)local_4b8);
        sptk::PrintErrorMessage((string *)&waveform_generation,&error_message_7);
        this = &waveform_generation;
      }
      else {
        sptk::PeriodicWaveformGeneration::PeriodicWaveformGeneration
                  (&waveform_generation,unvoiced_value,(bool)((byte)local_4d0 & 1),
                   &input_source_interpolation_with_magic_number);
        if (waveform_generation.is_valid_ != false) {
          sin = (double *)0x0;
          if (local_4d4 == 0) {
            sin = &signal;
          }
          cos = (double *)0x0;
          if (local_4d4 == 1) {
            cos = &signal;
          }
          sawtooth = &signal;
          if (local_4d4 != 2) {
            sawtooth = (double *)0x0;
          }
          break;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
        std::operator<<((ostream *)&error_message_7,
                        "Failed to initialize PeriodicWaveformGeneration");
        std::__cxx11::string::string((string *)local_4b8,"pitch2sin",(allocator *)&signal);
        sptk::PrintErrorMessage((string *)local_4b8,&error_message_7);
        this = (PeriodicWaveformGeneration *)local_4b8;
      }
      std::__cxx11::string::~string((string *)this);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
      goto LAB_00103db6;
    }
    switch(iVar4) {
    case 0x68:
      anon_unknown.dwarf_1e42::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&interpolation_period);
      bVar1 = interpolation_period < 0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -i option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::__cxx11::string::string
                  ((string *)&error_message_7,"pitch2sin",
                   (allocator *)&input_source_interpolation_with_magic_number);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_00103954;
      }
      break;
    default:
      goto switchD_0010366a_caseD_6a;
    case 0x6f:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)&ifs,(int *)&input_source_interpolation_with_magic_number);
      if (bVar2) {
        bVar2 = sptk::IsInRange((int)input_source_interpolation_with_magic_number.
                                     super_InputSourceInterface._vptr_InputSourceInterface,0,2);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar2) {
          local_4d4 = (int)input_source_interpolation_with_magic_number.super_InputSourceInterface.
                           _vptr_InputSourceInterface;
          break;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -o option must be an integer ")
      ;
      poVar5 = std::operator<<(poVar5,"in the range of ");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
      poVar5 = std::operator<<(poVar5," to ");
      std::ostream::operator<<((ostream *)poVar5,2);
      std::__cxx11::string::string
                ((string *)&error_message_7,"pitch2sin",(allocator *)&waveform_generation);
      sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
      goto LAB_00103954;
    case 0x70:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&frame_period);
      bVar2 = frame_period < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -p option must be a positive integer")
        ;
        std::__cxx11::string::string
                  ((string *)&error_message_7,"pitch2sin",
                   (allocator *)&input_source_interpolation_with_magic_number);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_00103954;
      }
      break;
    case 0x73:
      local_4d0 = CONCAT71((int7)((ulong)((long)&switchD_0010366a::switchdataD_0010c004 +
                                         (long)(int)(&switchD_0010366a::switchdataD_0010c004)
                                                    [iVar4 - 0x68U]) >> 8),1);
      break;
    case 0x75:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&unvoiced_value);
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -u option must be a number");
        std::__cxx11::string::string
                  ((string *)&error_message_7,"pitch2sin",
                   (allocator *)&input_source_interpolation_with_magic_number);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
LAB_00103954:
        std::__cxx11::string::~string((string *)&error_message_7);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
    }
  } while( true );
  while (bVar2 = sptk::WriteStream<double>(signal,(ostream *)&std::cout), bVar2) {
    bVar2 = sptk::PeriodicWaveformGeneration::Get
                      (&waveform_generation,sin,cos,sawtooth,(double *)0x0);
    if (!bVar2) {
      iVar4 = 0;
      goto LAB_00103db6;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
  std::operator<<((ostream *)&error_message_7,"Failed to write a periodic waveform");
  std::__cxx11::string::string((string *)local_4b8,"pitch2sin",&local_4d5);
  sptk::PrintErrorMessage((string *)local_4b8,&error_message_7);
  std::__cxx11::string::~string((string *)local_4b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
  iVar4 = 1;
LAB_00103db6:
  sptk::InputSourceInterpolationWithMagicNumber::~InputSourceInterpolationWithMagicNumber
            (&input_source_interpolation_with_magic_number);
LAB_00103dc3:
  std::ifstream::~ifstream(&ifs);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  OutputFormats output_format(kDefaultOutputFormat);
  double unvoiced_value(kDefaultUnvoicedValue);
  bool strict(kDefaultStrictFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "p:i:o:u:sh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &unvoiced_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be a number";
          sptk::PrintErrorMessage("pitch2sin", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        strict = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("pitch2sin", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::InputSourceFromStream input_source_from_stream(false, 1, &input_stream);
  sptk::InputSourceInterpolationWithMagicNumber
      input_source_interpolation_with_magic_number(
          frame_period, interpolation_period, false,
          kMagicNumberForUnvoicedFrame, &input_source_from_stream);
  if (!input_source_interpolation_with_magic_number.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSourceFromStream";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  sptk::PeriodicWaveformGeneration waveform_generation(
      unvoiced_value, strict, &input_source_interpolation_with_magic_number);
  if (!waveform_generation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize PeriodicWaveformGeneration";
    sptk::PrintErrorMessage("pitch2sin", error_message);
    return 1;
  }

  double signal;
  while (waveform_generation.Get(kSine == output_format ? &signal : NULL,
                                 kCosine == output_format ? &signal : NULL,
                                 kSawtooth == output_format ? &signal : NULL,
                                 NULL)) {
    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a periodic waveform";
      sptk::PrintErrorMessage("pitch2sin", error_message);
      return 1;
    }
  }

  return 0;
}